

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocator.cpp
# Opt level: O2

void __thiscall
xscript::parser::register_allocator::register_allocator(register_allocator *this,int32_t max)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&this->regs);
  if (0 < max) {
    while (uStack_28 = CONCAT44(max + -1,(undefined4)uStack_28), 0 < max) {
      std::deque<int,_std::allocator<int>_>::push_back
                ((deque<int,_std::allocator<int>_> *)this,
                 (value_type_conflict1 *)((long)&uStack_28 + 4));
      max = uStack_28._4_4_;
    }
    return;
  }
  __assert_fail("max > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/register_allocator.cpp"
                ,0xb,"xscript::parser::register_allocator::register_allocator(int32_t)");
}

Assistant:

register_allocator::register_allocator(int32_t max) {
    assert(max > 0);
    
    for (int32_t i = max-1 ; i >= 0 ; i--) {
        regs.push(i);
    }
}